

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_adjust_closed_stream(nghttp2_session *session)

{
  nghttp2_stream *stream;
  nghttp2_stream *pnVar1;
  int iVar2;
  nghttp2_stream **ppnVar3;
  size_t sVar4;
  uint uVar5;
  
  uVar5 = (session->local_settings).max_concurrent_streams;
  if (uVar5 == 0xffffffff) {
    uVar5 = session->pending_local_max_concurrent_stream;
  }
  sVar4 = session->num_closed_streams;
  if (sVar4 != 0) {
    do {
      if (sVar4 + session->num_incoming_streams <= (ulong)uVar5) {
        return 0;
      }
      stream = session->closed_stream_head;
      if (stream == (nghttp2_stream *)0x0) {
        __assert_fail("head_stream",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0x680,"int nghttp2_session_adjust_closed_stream(nghttp2_session *)");
      }
      pnVar1 = stream->closed_next;
      iVar2 = nghttp2_session_destroy_stream(session,stream);
      if (iVar2 != 0) {
        return iVar2;
      }
      session->closed_stream_head = pnVar1;
      ppnVar3 = &pnVar1->closed_prev;
      if (pnVar1 == (nghttp2_stream *)0x0) {
        ppnVar3 = &session->closed_stream_tail;
      }
      *ppnVar3 = (nghttp2_stream *)0x0;
      sVar4 = session->num_closed_streams - 1;
      session->num_closed_streams = sVar4;
    } while (sVar4 != 0);
  }
  return 0;
}

Assistant:

int nghttp2_session_adjust_closed_stream(nghttp2_session *session) {
  size_t num_stream_max;
  int rv;

  if (session->local_settings.max_concurrent_streams ==
      NGHTTP2_DEFAULT_MAX_CONCURRENT_STREAMS) {
    num_stream_max = session->pending_local_max_concurrent_stream;
  } else {
    num_stream_max = session->local_settings.max_concurrent_streams;
  }

  DEBUGF("stream: adjusting kept closed streams num_closed_streams=%zu, "
         "num_incoming_streams=%zu, max_concurrent_streams=%zu\n",
         session->num_closed_streams, session->num_incoming_streams,
         num_stream_max);

  while (session->num_closed_streams > 0 &&
         session->num_closed_streams + session->num_incoming_streams >
           num_stream_max) {
    nghttp2_stream *head_stream;
    nghttp2_stream *next;

    head_stream = session->closed_stream_head;

    assert(head_stream);

    next = head_stream->closed_next;

    rv = nghttp2_session_destroy_stream(session, head_stream);
    if (rv != 0) {
      return rv;
    }

    /* head_stream is now freed */

    session->closed_stream_head = next;

    if (session->closed_stream_head) {
      session->closed_stream_head->closed_prev = NULL;
    } else {
      session->closed_stream_tail = NULL;
    }

    --session->num_closed_streams;
  }

  return 0;
}